

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

int rlGetPixelDataSize(int width,int height,int format)

{
  int local_1c;
  int local_18;
  int bpp;
  int dataSize;
  int format_local;
  int height_local;
  int width_local;
  
  local_1c = 0;
  switch(format) {
  case 1:
    local_1c = 8;
    break;
  case 2:
  case 3:
  case 5:
  case 6:
    local_1c = 0x10;
    break;
  case 4:
    local_1c = 0x18;
    break;
  case 7:
    local_1c = 0x20;
    break;
  case 8:
    local_1c = 0x20;
    break;
  case 9:
    local_1c = 0x60;
    break;
  case 10:
    local_1c = 0x80;
    break;
  case 0xb:
  case 0xc:
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
    local_1c = 4;
    break;
  case 0xd:
  case 0xe:
  case 0x11:
  case 0x14:
    local_1c = 8;
    break;
  case 0x15:
    local_1c = 2;
  }
  local_18 = (width * height * local_1c) / 8;
  if ((width < 4) && (height < 4)) {
    if ((format < 0xb) || (0xc < format)) {
      if ((0xc < format) && (format < 0x15)) {
        local_18 = 0x10;
      }
    }
    else {
      local_18 = 8;
    }
  }
  return local_18;
}

Assistant:

static int rlGetPixelDataSize(int width, int height, int format)
{
    int dataSize = 0;       // Size in bytes
    int bpp = 0;            // Bits per pixel

    switch (format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE: bpp = 8; break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4: bpp = 16; break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8: bpp = 32; break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8: bpp = 24; break;
        case PIXELFORMAT_UNCOMPRESSED_R32: bpp = 32; break;
        case PIXELFORMAT_UNCOMPRESSED_R32G32B32: bpp = 32*3; break;
        case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32: bpp = 32*4; break;
        case PIXELFORMAT_COMPRESSED_DXT1_RGB:
        case PIXELFORMAT_COMPRESSED_DXT1_RGBA:
        case PIXELFORMAT_COMPRESSED_ETC1_RGB:
        case PIXELFORMAT_COMPRESSED_ETC2_RGB:
        case PIXELFORMAT_COMPRESSED_PVRT_RGB:
        case PIXELFORMAT_COMPRESSED_PVRT_RGBA: bpp = 4; break;
        case PIXELFORMAT_COMPRESSED_DXT3_RGBA:
        case PIXELFORMAT_COMPRESSED_DXT5_RGBA:
        case PIXELFORMAT_COMPRESSED_ETC2_EAC_RGBA:
        case PIXELFORMAT_COMPRESSED_ASTC_4x4_RGBA: bpp = 8; break;
        case PIXELFORMAT_COMPRESSED_ASTC_8x8_RGBA: bpp = 2; break;
        default: break;
    }

    dataSize = width*height*bpp/8;  // Total data size in bytes

    // Most compressed formats works on 4x4 blocks,
    // if texture is smaller, minimum dataSize is 8 or 16
    if ((width < 4) && (height < 4))
    {
        if ((format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) && (format < PIXELFORMAT_COMPRESSED_DXT3_RGBA)) dataSize = 8;
        else if ((format >= PIXELFORMAT_COMPRESSED_DXT3_RGBA) && (format < PIXELFORMAT_COMPRESSED_ASTC_8x8_RGBA)) dataSize = 16;
    }

    return dataSize;
}